

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbinflow.cpp
# Opt level: O2

void __thiscall
pele::physics::turbinflow::TurbInflow::add_turb
          (TurbInflow *this,Box *bx,FArrayBox *data,int dcomp,Geometry *geom,Real time,int dir,
          Side *side)

{
  pointer pTVar1;
  undefined8 uVar2;
  int iVar3;
  Box *pBVar4;
  Arena *ar;
  long lVar5;
  ulong uVar6;
  pointer pdVar7;
  long lVar8;
  uint transDir2;
  bool bVar9;
  IntVect IVar10;
  allocator_type local_111;
  int local_110;
  int local_10c;
  Box bvalsBox;
  Box local_c4;
  Vector<double,_std::allocator<double>_> x;
  Vector<double,_std::allocator<double>_> y;
  FArrayBox v;
  
  uVar2 = *(undefined8 *)((bx->smallend).vect + 2);
  bvalsBox.bigend.vect[1] = (int)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
  bvalsBox._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
  bvalsBox.smallend.vect._0_8_ = *(undefined8 *)(bx->smallend).vect;
  bvalsBox.smallend.vect[2] = (int)uVar2;
  bvalsBox.bigend.vect[0] = (int)((ulong)uVar2 >> 0x20);
  pBVar4 = (Box *)&(geom->domain).bigend;
  if (*side == low) {
    pBVar4 = &geom->domain;
  }
  iVar3 = (pBVar4->smallend).vect[dir] + (uint)(*side != low) * 2 + -1;
  bvalsBox.smallend.vect[dir] = iVar3;
  bvalsBox.bigend.vect[dir] = iVar3;
  bVar9 = dir == 0;
  transDir2 = (dir != 2) + 1;
  local_c4.smallend.vect[0] = bvalsBox.smallend.vect[bVar9];
  local_c4.bigend.vect[0] = bvalsBox.bigend.vect[bVar9];
  uVar6 = (ulong)((uint)(dir != 2) * 4 + 4);
  local_c4.smallend.vect[1] = *(int *)((long)bvalsBox.smallend.vect + uVar6);
  local_c4.bigend.vect[1] = *(int *)((long)bvalsBox.bigend.vect + uVar6);
  local_c4.btype.itype = 0;
  local_110 = dir;
  local_10c = dcomp;
  local_c4.smallend.vect[2] = iVar3;
  local_c4.bigend.vect[2] = iVar3;
  ar = amrex::The_Async_Arena();
  amrex::FArrayBox::FArrayBox((FArrayBox *)&v.super_BaseFab<double>,&local_c4,3,ar);
  x.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  amrex::BaseFab<double>::setVal<(amrex::RunOn)0>(&v.super_BaseFab<double>,(double *)&x);
  lVar8 = 0;
  while( true ) {
    pTVar1 = (this->tp).
             super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
             .
             super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((long)(this->tp).
               super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               .
               super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x110 <= lVar8) break;
    if ((*(int *)((long)(pTVar1 + lVar8) + 0x90) == local_110) &&
       (*(Side *)((long)(pTVar1 + lVar8) + 0x94) == *side)) {
      IVar10 = amrex::Box::size(&local_c4);
      std::vector<double,_std::allocator<double>_>::vector
                (&x.super_vector<double,_std::allocator<double>_>,(long)IVar10.vect[0],
                 (allocator_type *)&y);
      IVar10 = amrex::Box::size(&local_c4);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&y,IVar10.vect._0_8_ >> 0x20,&local_111)
      ;
      pTVar1 = (this->tp).
               super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               .
               super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar7 = x.super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      for (lVar5 = (long)local_c4.smallend.vect[0]; lVar5 <= local_c4.bigend.vect[0];
          lVar5 = lVar5 + 1) {
        *pdVar7 = (((double)(int)lVar5 + 0.5) * (geom->super_CoordSys).dx[bVar9] +
                  (geom->prob_domain).xlo[bVar9]) * *(Real *)((long)(pTVar1 + lVar8) + 200);
        pdVar7 = pdVar7 + 1;
      }
      pTVar1 = (this->tp).
               super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               .
               super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar7 = y.super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      for (lVar5 = (long)local_c4.smallend.vect[1]; lVar5 <= local_c4.bigend.vect[1];
          lVar5 = lVar5 + 1) {
        *pdVar7 = (((double)(int)lVar5 + 0.5) * (geom->super_CoordSys).dx[transDir2] +
                  (geom->prob_domain).xlo[transDir2]) * *(Real *)((long)(pTVar1 + lVar8) + 200);
        pdVar7 = pdVar7 + 1;
      }
      pTVar1 = (this->tp).
               super_vector<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               .
               super__Vector_base<pele::physics::turbinflow::TurbParm,_std::allocator<pele::physics::turbinflow::TurbParm>_>
               ._M_impl.super__Vector_impl_data._M_start;
      fill_turb_plane(pTVar1 + lVar8,&x,&y,
                      (*(Real *)((long)(pTVar1 + lVar8) + 0x98) + time) *
                      *(Real *)((long)(pTVar1 + lVar8) + 0xd8) *
                      *(Real *)((long)(pTVar1 + lVar8) + 200),&v);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&y);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&x);
    }
    lVar8 = lVar8 + 1;
  }
  set_turb(local_110,(uint)(local_110 == 0),transDir2,(FArrayBox *)&v.super_BaseFab<double>,data,
           local_10c);
  amrex::BaseFab<double>::~BaseFab(&v.super_BaseFab<double>);
  return;
}

Assistant:

void
TurbInflow::add_turb(
  amrex::Box const& bx,
  amrex::FArrayBox& data,
  const int dcomp,
  amrex::Geometry const& geom,
  const amrex::Real time,
  const int dir,
  const amrex::Orientation::Side& side)
{
  AMREX_ASSERT(turbinflow_initialized);

  // Box on which we will access data
  amrex::Box bvalsBox = bx;
  int planeLoc =
    (side == amrex::Orientation::low ? geom.Domain().smallEnd()[dir] - 1
                                     : geom.Domain().bigEnd()[dir] + 1);
  bvalsBox.setSmall(dir, planeLoc);
  bvalsBox.setBig(dir, planeLoc);

  // Define box that we will fill with turb: need to be z-normal
  // Get transverse directions
  int tdir1 = (dir != 0) ? 0 : 1;
  int tdir2 = (dir != 0) ? ((dir == 2) ? 1 : 2) : 2;
  int tr1Lo = bvalsBox.smallEnd()[tdir1];
  int tr1Hi = bvalsBox.bigEnd()[tdir1];
  int tr2Lo = bvalsBox.smallEnd()[tdir2];
  int tr2Hi = bvalsBox.bigEnd()[tdir2];
  const amrex::IntVect lo(AMREX_D_DECL(tr1Lo, tr2Lo, planeLoc));
  const amrex::IntVect hi(AMREX_D_DECL(tr1Hi, tr2Hi, planeLoc));
  amrex::Box turbBox(lo, hi);
  amrex::FArrayBox v(turbBox, 3, amrex::The_Async_Arena());
  v.setVal<amrex::RunOn::Device>(0);

  // Add turbulence from all the tp acting on this face
  for (int n = 0; n < tp.size(); n++) {

    if (tp[n].dir == dir && tp[n].side == side) {

      // 0 and 1 are the two transverse directions
      amrex::Vector<amrex::Real> x(turbBox.size()[0]), y(turbBox.size()[1]);
      for (int i = turbBox.smallEnd()[0]; i <= turbBox.bigEnd()[0]; ++i) {
        x[i - turbBox.smallEnd()[0]] =
          (geom.ProbLo()[tdir1] + (i + 0.5) * geom.CellSize(tdir1)) *
          tp[n].turb_scale_loc;
      }
      for (int j = turbBox.smallEnd()[1]; j <= turbBox.bigEnd()[1]; ++j) {
        y[j - turbBox.smallEnd()[1]] =
          (geom.ProbLo()[tdir2] + (j + 0.5) * geom.CellSize(tdir2)) *
          tp[n].turb_scale_loc;
      }

      // Get the turbulence
      amrex::Real z =
        (time + tp[n].time_shift) * tp[n].turb_conv_vel * tp[n].turb_scale_loc;
      fill_turb_plane(tp[n], x, y, z, v);
    }
  }

  // Moving it into data
  set_turb(dir, tdir1, tdir2, v, data, dcomp);

#if 0
  std::string junk = "TurbV_AftTP"+std::to_string(n)+"_D";
  std::ofstream os;
  os.precision(15);
  os.open(junk.c_str());
  data.writeOn(os);
  os.close();
  amrex::Abort();
#endif
}